

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O0

void __thiscall Logger::~Logger(Logger *this)

{
  int len;
  LogStream *this_00;
  Buffer *this_01;
  char *msg;
  Buffer *buf;
  Logger *this_local;
  
  LogStream::operator<<((LogStream *)this,"\n+-----------------------+\n");
  this_00 = stream(this);
  this_01 = LogStream::buffer(this_00);
  msg = FixedBuffer<4000>::data(this_01);
  len = FixedBuffer<4000>::length(this_01);
  output(msg,len);
  Impl::~Impl(&this->impl_);
  return;
}

Assistant:

Logger::~Logger()
{
    //printf("Class Logger num:%d Deleted!\n",ClassNum_);
    impl_.stream_ << "\n+-----------------------+\n";
    //impl_.stream_ << " -- " << impl_.basename_ << ':' << impl_.line_ << '\n';
    //impl_.stream_ << "-------------------------\n";

    const LogStream::Buffer& buf(stream().buffer());
    output(buf.data(), buf.length());
}